

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign0.c
# Opt level: O1

_Bool COSE_Sign0_validate_eckey(HCOSE_SIGN0 hSign,eckey_t_conflict *eckey,cose_errback *perr)

{
  _Bool _Var1;
  cn_cbor *pcVar2;
  
  if ((hSign == (HCOSE_SIGN0)0x0) || (_Var1 = _COSE_IsInList(Sign0Root,(COSE *)hSign), !_Var1)) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_HANDLE;
    }
    return false;
  }
  pcVar2 = _COSE_arrayget_int((COSE *)hSign,2);
  if ((pcVar2 != (cn_cbor *)0x0) &&
     (((pcVar2->type == CN_CBOR_BYTES &&
       (pcVar2 = _COSE_arrayget_int((COSE *)hSign,0), pcVar2 != (cn_cbor *)0x0)) &&
      (pcVar2->type == CN_CBOR_BYTES)))) {
    _Var1 = _COSE_Signer0_validate((COSE_Sign0Message *)hSign,eckey,perr);
    return _Var1;
  }
  if (perr == (cose_errback *)0x0) {
    return false;
  }
  perr->err = COSE_ERR_INVALID_PARAMETER;
  return false;
}

Assistant:

bool COSE_Sign0_validate_eckey(HCOSE_SIGN0 hSign, const eckey_t * eckey, cose_errback * perr)
{
	bool f;
	COSE_Sign0Message * pSign;
	const cn_cbor * cnContent;
	const cn_cbor * cnProtected;

	CHECK_CONDITION(IsValidSign0Handle(hSign), COSE_ERR_INVALID_HANDLE);

	pSign = (COSE_Sign0Message *)hSign;

	cnContent = _COSE_arrayget_int(&pSign->m_message, INDEX_BODY);
	CHECK_CONDITION(cnContent != NULL && cnContent->type == CN_CBOR_BYTES, COSE_ERR_INVALID_PARAMETER);

	cnProtected = _COSE_arrayget_int(&pSign->m_message, INDEX_PROTECTED);
	CHECK_CONDITION(cnProtected != NULL && cnProtected->type == CN_CBOR_BYTES, COSE_ERR_INVALID_PARAMETER);

	f = _COSE_Signer0_validate(pSign, eckey,  perr);

	return f;

errorReturn:
	return false;
}